

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlStaticCopyNode(xmlNodePtr node,xmlDocPtr doc,xmlNodePtr parent,int extended)

{
  long lVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlNsPtr pxVar4;
  _xmlDoc *p_Var5;
  xmlEntityPtr pxVar6;
  xmlNodePtr pxVar7;
  xmlRegisterNodeFunc *pp_Var8;
  xmlNodePtr copy;
  xmlNodePtr insert;
  xmlNodePtr cur;
  xmlNodePtr root;
  xmlNsPtr pxStack_40;
  int res;
  xmlNsPtr ns;
  xmlNodePtr ret;
  _xmlDoc *p_Stack_28;
  int extended_local;
  xmlNodePtr parent_local;
  xmlDocPtr doc_local;
  xmlNodePtr node_local;
  
  if (node == (xmlNodePtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  ret._4_4_ = extended;
  p_Stack_28 = (_xmlDoc *)parent;
  parent_local = (xmlNodePtr)doc;
  doc_local = (xmlDocPtr)node;
  switch(node->type) {
  case XML_ELEMENT_NODE:
  case XML_TEXT_NODE:
  case XML_CDATA_SECTION_NODE:
  case XML_ENTITY_REF_NODE:
  case XML_PI_NODE:
  case XML_COMMENT_NODE:
  case XML_DOCUMENT_FRAG_NODE:
  case XML_XINCLUDE_START:
  case XML_XINCLUDE_END:
    ns = (xmlNsPtr)(*xmlMalloc)(0x78);
    if (ns == (xmlNsPtr)0x0) {
      return (xmlNodePtr)0x0;
    }
    memset(ns,0,0x78);
    ns->type = doc_local->type;
    ns[1].href = (xmlChar *)parent_local;
    ns->context = p_Stack_28;
    if ((xmlChar *)doc_local->name == "text") {
      ns->href = "text";
    }
    else if ((xmlChar *)doc_local->name == "textnoenc") {
      ns->href = "textnoenc";
    }
    else if ((xmlChar *)doc_local->name == "comment") {
      ns->href = "comment";
    }
    else if (doc_local->name != (char *)0x0) {
      if ((parent_local == (xmlNodePtr)0x0) || (parent_local[1].last == (_xmlNode *)0x0)) {
        pxVar3 = xmlStrdup((xmlChar *)doc_local->name);
        ns->href = pxVar3;
      }
      else {
        pxVar3 = xmlDictLookup((xmlDictPtr)parent_local[1].last,(xmlChar *)doc_local->name,-1);
        ns->href = pxVar3;
      }
      if (ns->href == (xmlChar *)0x0) goto LAB_0016604e;
    }
    if ((((doc_local->type == XML_ELEMENT_NODE) || (doc_local->intSubset == (_xmlDtd *)0x0)) ||
        (doc_local->type == XML_ENTITY_REF_NODE)) ||
       ((doc_local->type == XML_XINCLUDE_END || (doc_local->type == XML_XINCLUDE_START)))) {
      if (doc_local->type == XML_ELEMENT_NODE) {
        *(undefined2 *)&ns[2].href = *(undefined2 *)&doc_local->encoding;
      }
    }
    else {
      pxVar3 = xmlStrdup((xmlChar *)doc_local->intSubset);
      ns[1]._private = pxVar3;
      if (ns[1]._private == (void *)0x0) goto LAB_0016604e;
    }
    if (ret._4_4_ != 0) {
      if (((doc_local->type == XML_ELEMENT_NODE) || (doc_local->type == XML_XINCLUDE_START)) &&
         (doc_local->oldNs != (_xmlNs *)0x0)) {
        pxVar4 = xmlCopyNamespaceList(doc_local->oldNs);
        ns[2].next = pxVar4;
        if (ns[2].next == (_xmlNs *)0x0) goto LAB_0016604e;
      }
      if ((doc_local->type == XML_ELEMENT_NODE) &&
         (lVar1._0_4_ = doc_local->compression, lVar1._4_4_ = doc_local->standalone, lVar1 != 0)) {
        pxStack_40 = (xmlNsPtr)0x0;
        iVar2 = xmlSearchNsSafe((xmlNodePtr)ns,
                                *(xmlChar **)(*(long *)&doc_local->compression + 0x18),
                                &stack0xffffffffffffffc0);
        if (iVar2 < 0) goto LAB_0016604e;
        if (pxStack_40 == (xmlNsPtr)0x0) {
          iVar2 = xmlSearchNsSafe((xmlNodePtr)doc_local,
                                  *(xmlChar **)(*(long *)&doc_local->compression + 0x18),
                                  &stack0xffffffffffffffc0);
          if (iVar2 < 0) goto LAB_0016604e;
          if (pxStack_40 == (xmlNsPtr)0x0) {
            pxVar4 = xmlNewReconciledNs((xmlNodePtr)ns,*(xmlNsPtr *)&doc_local->compression);
            ns[1].prefix = (xmlChar *)pxVar4;
          }
          else {
            for (cur = (xmlNodePtr)ns; cur->parent != (_xmlNode *)0x0; cur = cur->parent) {
            }
            pxVar4 = xmlNewNs(cur,pxStack_40->href,pxStack_40->prefix);
            ns[1].prefix = (xmlChar *)pxVar4;
          }
          if (ns[1].prefix == (xmlChar *)0x0) goto LAB_0016604e;
        }
        else {
          ns[1].prefix = (xmlChar *)pxStack_40;
        }
      }
      if ((doc_local->type == XML_ELEMENT_NODE) && (doc_local->extSubset != (_xmlDtd *)0x0)) {
        p_Var5 = (_xmlDoc *)xmlCopyPropList((xmlNodePtr)ns,(xmlAttrPtr)doc_local->extSubset);
        ns[1].context = p_Var5;
        if (ns[1].context == (_xmlDoc *)0x0) {
LAB_0016604e:
          xmlFreeNode((xmlNodePtr)ns);
          return (xmlNodePtr)0x0;
        }
      }
      if (doc_local->type == XML_ENTITY_REF_NODE) {
        if ((parent_local == (xmlNodePtr)0x0) || (doc_local->doc != (_xmlDoc *)parent_local)) {
          pxVar6 = xmlGetDocEntity((xmlDoc *)parent_local,ns->href);
          ns->prefix = (xmlChar *)pxVar6;
        }
        else {
          ns->prefix = (xmlChar *)doc_local->children;
        }
        ns->_private = ns->prefix;
      }
      else if ((doc_local->children != (_xmlNode *)0x0) && (ret._4_4_ != 2)) {
        insert = doc_local->children;
        copy = (xmlNodePtr)ns;
LAB_00165f1c:
        if (insert != (xmlNodePtr)0x0) {
          pxVar7 = xmlStaticCopyNode(insert,(xmlDocPtr)parent_local,copy,2);
          if (pxVar7 == (xmlNodePtr)0x0) goto LAB_0016604e;
          if (copy->last != pxVar7) {
            if (copy->last == (_xmlNode *)0x0) {
              copy->children = pxVar7;
            }
            else {
              pxVar7->prev = copy->last;
              copy->last->next = pxVar7;
            }
            copy->last = pxVar7;
          }
          if ((insert->type == XML_ENTITY_REF_NODE) || (insert->children == (_xmlNode *)0x0)) {
            do {
              if (insert->next != (_xmlNode *)0x0) {
                insert = insert->next;
                goto LAB_00165f1c;
              }
              insert = insert->parent;
              copy = copy->parent;
            } while ((xmlDocPtr)insert != doc_local);
            insert = (xmlNodePtr)0x0;
          }
          else {
            insert = insert->children;
            copy = pxVar7;
          }
          goto LAB_00165f1c;
        }
      }
    }
    if ((xmlRegisterCallbacks != 0) &&
       (pp_Var8 = __xmlRegisterNodeDefaultValue(), *pp_Var8 != (xmlRegisterNodeFunc)0x0)) {
      pp_Var8 = __xmlRegisterNodeDefaultValue();
      (**pp_Var8)((xmlNodePtr)ns);
    }
    node_local = (xmlNodePtr)ns;
    break;
  case XML_ATTRIBUTE_NODE:
    node_local = (xmlNodePtr)xmlCopyPropInternal(doc,parent,(xmlAttrPtr)node);
    break;
  default:
    node_local = (xmlNodePtr)0x0;
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    node_local = (xmlNodePtr)xmlCopyDoc((xmlDocPtr)node,extended);
    break;
  case XML_NAMESPACE_DECL:
    node_local = (xmlNodePtr)xmlCopyNamespaceList((xmlNsPtr)node);
  }
  return node_local;
}

Assistant:

xmlNodePtr
xmlStaticCopyNode(xmlNodePtr node, xmlDocPtr doc, xmlNodePtr parent,
                  int extended) {
    xmlNodePtr ret;

    if (node == NULL) return(NULL);
    switch (node->type) {
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ELEMENT_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
	    break;
        case XML_ATTRIBUTE_NODE:
		return((xmlNodePtr) xmlCopyPropInternal(doc, parent, (xmlAttrPtr) node));
        case XML_NAMESPACE_DECL:
	    return((xmlNodePtr) xmlCopyNamespaceList((xmlNsPtr) node));

        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    return((xmlNodePtr) xmlCopyDoc((xmlDocPtr) node, extended));
        default:
            return(NULL);
    }

    /*
     * Allocate a new node and fill the fields.
     */
    ret = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0, sizeof(xmlNode));
    ret->type = node->type;

    ret->doc = doc;
    ret->parent = parent;
    if (node->name == xmlStringText)
	ret->name = xmlStringText;
    else if (node->name == xmlStringTextNoenc)
	ret->name = xmlStringTextNoenc;
    else if (node->name == xmlStringComment)
	ret->name = xmlStringComment;
    else if (node->name != NULL) {
        if ((doc != NULL) && (doc->dict != NULL))
	    ret->name = xmlDictLookup(doc->dict, node->name, -1);
	else
	    ret->name = xmlStrdup(node->name);
        if (ret->name == NULL)
            goto error;
    }
    if ((node->type != XML_ELEMENT_NODE) &&
	(node->content != NULL) &&
	(node->type != XML_ENTITY_REF_NODE) &&
	(node->type != XML_XINCLUDE_END) &&
	(node->type != XML_XINCLUDE_START)) {
	ret->content = xmlStrdup(node->content);
        if (ret->content == NULL)
            goto error;
    }else{
      if (node->type == XML_ELEMENT_NODE)
        ret->line = node->line;
    }

    if (!extended)
	goto out;
    if (((node->type == XML_ELEMENT_NODE) ||
         (node->type == XML_XINCLUDE_START)) && (node->nsDef != NULL)) {
        ret->nsDef = xmlCopyNamespaceList(node->nsDef);
        if (ret->nsDef == NULL)
            goto error;
    }

    if ((node->type == XML_ELEMENT_NODE) && (node->ns != NULL)) {
        xmlNsPtr ns = NULL;
        int res;

	res = xmlSearchNsSafe(ret, node->ns->prefix, &ns);
        if (res < 0)
            goto error;
	if (ns == NULL) {
	    /*
	     * Humm, we are copying an element whose namespace is defined
	     * out of the new tree scope. Search it in the original tree
	     * and add it at the top of the new tree.
             *
             * TODO: Searching the original tree seems unnecessary. We
             * already have a namespace URI.
	     */
	    res = xmlSearchNsSafe(node, node->ns->prefix, &ns);
            if (res < 0)
                goto error;
	    if (ns != NULL) {
	        xmlNodePtr root = ret;

		while (root->parent != NULL) root = root->parent;
		ret->ns = xmlNewNs(root, ns->href, ns->prefix);
            } else {
                ret->ns = xmlNewReconciledNs(ret, node->ns);
	    }
            if (ret->ns == NULL)
                goto error;
	} else {
	    /*
	     * reference the existing namespace definition in our own tree.
	     */
	    ret->ns = ns;
	}
    }
    if ((node->type == XML_ELEMENT_NODE) && (node->properties != NULL)) {
        ret->properties = xmlCopyPropList(ret, node->properties);
        if (ret->properties == NULL)
            goto error;
    }
    if (node->type == XML_ENTITY_REF_NODE) {
	if ((doc == NULL) || (node->doc != doc)) {
	    /*
	     * The copied node will go into a separate document, so
	     * to avoid dangling references to the ENTITY_DECL node
	     * we cannot keep the reference. Try to find it in the
	     * target document.
	     */
	    ret->children = (xmlNodePtr) xmlGetDocEntity(doc, ret->name);
	} else {
            ret->children = node->children;
	}
	ret->last = ret->children;
    } else if ((node->children != NULL) && (extended != 2)) {
        xmlNodePtr cur, insert;

        cur = node->children;
        insert = ret;
        while (cur != NULL) {
            xmlNodePtr copy = xmlStaticCopyNode(cur, doc, insert, 2);
            if (copy == NULL)
                goto error;

            /* Check for coalesced text nodes */
            if (insert->last != copy) {
                if (insert->last == NULL) {
                    insert->children = copy;
                } else {
                    copy->prev = insert->last;
                    insert->last->next = copy;
                }
                insert->last = copy;
            }

            if ((cur->type != XML_ENTITY_REF_NODE) &&
                (cur->children != NULL)) {
                cur = cur->children;
                insert = copy;
                continue;
            }

            while (1) {
                if (cur->next != NULL) {
                    cur = cur->next;
                    break;
                }

                cur = cur->parent;
                insert = insert->parent;
                if (cur == node) {
                    cur = NULL;
                    break;
                }
            }
        }
    }

out:
    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)ret);
    return(ret);

error:
    xmlFreeNode(ret);
    return(NULL);
}